

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O3

optional<spv::Capability>
spvtools::opt::Handler_OpTypePointer_StorageUniformBufferBlock16(Instruction *instruction)

{
  Op op;
  IRContext *pIVar1;
  DecorationManager *this;
  DefUseManager *this_00;
  pointer pOVar2;
  uint **ppuVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  uint32_t uVar8;
  int32_t iVar9;
  _Elt_pointer puVar10;
  Instruction *this_01;
  ulong uVar11;
  uint **ppuVar12;
  _Optional_payload_base<spv::Capability> _Var13;
  pointer pOVar14;
  uint uVar15;
  _func_bool_Instruction_ptr *predicate;
  FeatureManager *feature_manager;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
  instructions_to_visit;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> **local_c8;
  undefined8 local_c0;
  code *local_b8;
  code *local_b0;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  uint *local_58;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  
  if (instruction->opcode_ != OpTypePointer) {
    __assert_fail("instruction->opcode() == spv::Op::OpTypePointer && \"This handler only support OpTypePointer opcodes.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                  ,0xd6,
                  "std::optional<spv::Capability> spvtools::opt::Handler_OpTypePointer_StorageUniformBufferBlock16(const Instruction *)"
                 );
  }
  uVar8 = (instruction->has_result_id_ & 1) + 1;
  if (instruction->has_type_id_ == false) {
    uVar8 = (uint)instruction->has_result_id_;
  }
  uVar8 = Instruction::GetSingleWordOperand(instruction,uVar8);
  _Var13._M_payload = (_Storage<spv::Capability,_true>)0x1151;
  _Var13._M_engaged = false;
  _Var13._5_3_ = 0;
  if (uVar8 == 2) {
    pIVar1 = instruction->context_;
    feature_manager =
         (pIVar1->feature_mgr_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
         .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    if (feature_manager == (FeatureManager *)0x0) {
      IRContext::AnalyzeFeatures(pIVar1);
      feature_manager =
           (pIVar1->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    }
    bVar5 = anon_unknown_0::Has16BitCapability(feature_manager);
    if (bVar5) {
      pIVar1 = instruction->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
        IRContext::BuildDecorationManager(pIVar1);
      }
      this = (pIVar1->decoration_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
             _M_head_impl;
      op = instruction->opcode_;
      iVar9 = spvOpcodeGeneratesType(op);
      if ((op != OpTypeForwardPointer) && (iVar9 == 0)) {
        __assert_fail("IsTypeInst(instruction->opcode()) && \"AnyTypeOf called with a non-type instruction.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                      ,0x69,
                      "bool spvtools::opt::(anonymous namespace)::AnyTypeOf(const Instruction *, UnaryPredicate) [UnaryPredicate = (lambda at /workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp:230:30)]"
                     );
      }
      local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
      uVar8 = 0;
      std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map(&local_a8,0);
      if (instruction->has_result_id_ == true) {
        uVar8 = Instruction::GetSingleWordOperand(instruction,(uint)instruction->has_type_id_);
      }
      local_c8 = (_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> **)
                 CONCAT44(local_c8._4_4_,uVar8);
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,(uint *)&local_c8);
      pIVar1 = instruction->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar1);
      }
      if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_a8);
      }
      else {
        this_00 = (pIVar1->def_use_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                  _M_head_impl;
        bVar5 = false;
        do {
          puVar10 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            puVar10 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
          }
          this_01 = analysis::DefUseManager::GetDef(this_00,puVar10[-1]);
          if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_a8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
            local_a8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_a8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x80;
            local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x7f;
            local_a8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_a8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          bVar4 = true;
          if (!bVar5) {
            predicate = (_func_bool_Instruction_ptr *)0x0;
            if (this_01->has_result_id_ == true) {
              uVar8 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
              predicate = (_func_bool_Instruction_ptr *)(ulong)uVar8;
            }
            bVar6 = analysis::DecorationManager::HasDecoration(this,(uint32_t)predicate,BufferBlock)
            ;
            if (((!bVar6) ||
                (bVar6 = (anonymous_namespace)::
                         AnyTypeOf<bool(*)(spvtools::opt::Instruction_const*)>(this_01,predicate),
                !bVar6)) && (uVar11 = (ulong)this_01->opcode_, bVar4 = bVar5, uVar11 < 0x21)) {
              if ((0x31800000UL >> (uVar11 & 0x3f) & 1) == 0) {
                if (uVar11 == 0x1e) {
                  local_48 = 0;
                  local_50 = &local_a8;
                  local_38 = std::
                             _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp:91:30)>
                             ::_M_invoke;
                  local_40 = std::
                             _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp:91:30)>
                             ::_M_manager;
                  local_c0 = 0;
                  local_c8 = &local_50;
                  local_b0 = std::
                             _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:884:22)>
                             ::_M_invoke;
                  local_b8 = std::
                             _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:884:22)>
                             ::_M_manager;
                  pOVar14 = (this_01->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pOVar2 = (this_01->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  if (pOVar14 == pOVar2) {
LAB_005050f1:
                    (*local_b8)(&local_c8,&local_c8,3);
                  }
                  else {
                    do {
                      if ((pOVar14->type & ~SPV_OPERAND_TYPE_ID) != SPV_OPERAND_TYPE_TYPE_ID) {
                        ppuVar3 = (uint **)(pOVar14->words).large_data_._M_t.
                                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                           ._M_head_impl;
                        ppuVar12 = &(pOVar14->words).small_data_;
                        if (ppuVar3 != (uint **)0x0) {
                          ppuVar12 = ppuVar3;
                        }
                        local_58 = *ppuVar12;
                        if (local_b8 == (code *)0x0) {
                          std::__throw_bad_function_call();
                        }
                        cVar7 = (*local_b0)(&local_c8,&local_58);
                        if (cVar7 == '\0') break;
                      }
                      pOVar14 = pOVar14 + 1;
                    } while (pOVar14 != pOVar2);
                    if (local_b8 != (code *)0x0) goto LAB_005050f1;
                  }
                  if (local_40 != (code *)0x0) {
                    (*local_40)(&local_50,&local_50,3);
                  }
                  goto LAB_00505002;
                }
                if (uVar11 != 0x20) goto LAB_00505002;
                uVar15 = (this_01->has_result_id_ & 1) + 1;
                if (this_01->has_type_id_ == false) {
                  uVar15 = (uint)this_01->has_result_id_;
                }
                uVar8 = uVar15 + 1;
              }
              else {
                uVar8 = (this_01->has_result_id_ & 1) + 1;
                if (this_01->has_type_id_ == false) {
                  uVar8 = (uint)this_01->has_result_id_;
                }
              }
              uVar8 = Instruction::GetSingleWordOperand(this_01,uVar8);
              local_c8 = (_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> **)
                         CONCAT44(local_c8._4_4_,uVar8);
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
                         (uint *)&local_c8);
            }
          }
LAB_00505002:
          bVar5 = bVar4;
        } while (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_a8._M_impl.super__Deque_impl_data._M_start._M_cur);
        std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_a8);
        _Var13._M_payload = (_Storage<spv::Capability,_true>)0x1151;
        _Var13._M_engaged = false;
        _Var13._5_3_ = 0;
        if (bVar4) {
          _Var13._M_payload = (_Storage<spv::Capability,_true>)0x1151;
          _Var13._M_engaged = true;
          _Var13._5_3_ = 0;
        }
      }
    }
  }
  return (optional<spv::Capability>)_Var13;
}

Assistant:

static std::optional<spv::Capability>
Handler_OpTypePointer_StorageUniformBufferBlock16(
    const Instruction* instruction) {
  assert(instruction->opcode() == spv::Op::OpTypePointer &&
         "This handler only support OpTypePointer opcodes.");

  // This capability is only required if the variable has a Uniform storage
  // class.
  spv::StorageClass storage_class = spv::StorageClass(
      instruction->GetSingleWordInOperand(kOpTypePointerStorageClassIndex));
  if (storage_class != spv::StorageClass::Uniform) {
    return std::nullopt;
  }

  if (!Has16BitCapability(instruction->context()->get_feature_mgr())) {
    return std::nullopt;
  }

  const auto* decoration_mgr = instruction->context()->get_decoration_mgr();
  const bool matchesCondition =
      AnyTypeOf(instruction, [decoration_mgr](const Instruction* item) {
        if (!decoration_mgr->HasDecoration(item->result_id(),
                                           spv::Decoration::BufferBlock)) {
          return false;
        }

        return AnyTypeOf(item, is16bitType);
      });

  return matchesCondition
             ? std::optional(spv::Capability::StorageUniformBufferBlock16)
             : std::nullopt;
}